

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRulePlaceholderExpander.cxx
# Opt level: O3

void __thiscall
cmRulePlaceholderExpander::cmRulePlaceholderExpander
          (cmRulePlaceholderExpander *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *compilers,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variableMappings,string *compilerSysroot,string *linkerSysroot)

{
  pointer pcVar1;
  
  (this->TargetImpLib)._M_dataplus._M_p = (pointer)&(this->TargetImpLib).field_2;
  (this->TargetImpLib)._M_string_length = 0;
  (this->TargetImpLib).field_2._M_local_buf[0] = '\0';
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&(this->Compilers)._M_t,&compilers->_M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&(this->VariableMappings)._M_t,&variableMappings->_M_t);
  (this->CompilerSysroot)._M_dataplus._M_p = (pointer)&(this->CompilerSysroot).field_2;
  pcVar1 = (compilerSysroot->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->CompilerSysroot,pcVar1,pcVar1 + compilerSysroot->_M_string_length);
  (this->LinkerSysroot)._M_dataplus._M_p = (pointer)&(this->LinkerSysroot).field_2;
  pcVar1 = (linkerSysroot->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->LinkerSysroot,pcVar1,pcVar1 + linkerSysroot->_M_string_length);
  return;
}

Assistant:

cmRulePlaceholderExpander::cmRulePlaceholderExpander(
  std::map<std::string, std::string> const& compilers,
  std::map<std::string, std::string> const& variableMappings,
  std::string const& compilerSysroot, std::string const& linkerSysroot)
  : Compilers(compilers)
  , VariableMappings(variableMappings)
  , CompilerSysroot(compilerSysroot)
  , LinkerSysroot(linkerSysroot)
{
}